

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void VP8LHistogramAdd(VP8LHistogram *a,VP8LHistogram *b,VP8LHistogram *out)

{
  int iVar1;
  long lVar2;
  uint32_t *__src;
  uint32_t *puVar3;
  
  iVar1 = (1 << ((byte)a->palette_code_bits_ & 0x1f)) + 0x118;
  if (a->palette_code_bits_ < 1) {
    iVar1 = 0x118;
  }
  lVar2 = (long)iVar1;
  if (b == out) {
    if (a->is_used_[0] != '\0') {
      if (out->is_used_[0] == '\0') {
        memcpy(out->literal_,a->literal_,lVar2 << 2);
      }
      else {
        (*VP8LAddVectorEq)(a->literal_,out->literal_,iVar1);
      }
    }
    if (a->is_used_[1] != '\0') {
      if (out->is_used_[1] == '\0') {
        memcpy(out->red_,a->red_,0x400);
      }
      else {
        (*VP8LAddVectorEq)(a->red_,out->red_,0x100);
      }
    }
    if (a->is_used_[2] != '\0') {
      if (out->is_used_[2] == '\0') {
        memcpy(out->blue_,a->blue_,0x400);
      }
      else {
        (*VP8LAddVectorEq)(a->blue_,out->blue_,0x100);
      }
    }
    if (a->is_used_[3] != '\0') {
      if (out->is_used_[3] == '\0') {
        memcpy(out->alpha_,a->alpha_,0x400);
      }
      else {
        (*VP8LAddVectorEq)(a->alpha_,out->alpha_,0x100);
      }
    }
    if (a->is_used_[4] != '\0') {
      if (out->is_used_[4] == '\0') {
        memcpy(out->distance_,a->distance_,0xa0);
      }
      else {
        (*VP8LAddVectorEq)(a->distance_,out->distance_,0x28);
      }
    }
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      out->is_used_[lVar2] = out->is_used_[lVar2] | a->is_used_[lVar2];
    }
    return;
  }
  if (a->is_used_[0] == '\0') {
    puVar3 = out->literal_;
    if (b->is_used_[0] != '\0') {
      __src = b->literal_;
      goto LAB_00136a0e;
    }
    memset(puVar3,0,lVar2 << 2);
  }
  else {
    __src = a->literal_;
    if (b->is_used_[0] == '\0') {
      puVar3 = out->literal_;
LAB_00136a0e:
      memcpy(puVar3,__src,lVar2 << 2);
    }
    else {
      (*VP8LAddVector)(__src,b->literal_,out->literal_,iVar1);
    }
  }
  if (a->is_used_[1] == '\0') {
    if (b->is_used_[1] != '\0') {
      puVar3 = b->red_;
      goto LAB_00136aae;
    }
    memset(out->red_,0,0x400);
  }
  else {
    puVar3 = a->red_;
    if (b->is_used_[1] == '\0') {
LAB_00136aae:
      memcpy(out->red_,puVar3,0x400);
    }
    else {
      (*VP8LAddVector)(puVar3,b->red_,out->red_,0x100);
    }
  }
  if (a->is_used_[2] == '\0') {
    if (b->is_used_[2] != '\0') {
      puVar3 = b->blue_;
      goto LAB_00136b71;
    }
    memset(out->blue_,0,0x400);
  }
  else {
    puVar3 = a->blue_;
    if (b->is_used_[2] == '\0') {
LAB_00136b71:
      memcpy(out->blue_,puVar3,0x400);
    }
    else {
      (*VP8LAddVector)(puVar3,b->blue_,out->blue_,0x100);
    }
  }
  if (a->is_used_[3] == '\0') {
    if (b->is_used_[3] != '\0') {
      puVar3 = b->alpha_;
      goto LAB_00136c37;
    }
    memset(out->alpha_,0,0x400);
  }
  else {
    puVar3 = a->alpha_;
    if (b->is_used_[3] == '\0') {
LAB_00136c37:
      memcpy(out->alpha_,puVar3,0x400);
    }
    else {
      (*VP8LAddVector)(puVar3,b->alpha_,out->alpha_,0x100);
    }
  }
  if (a->is_used_[4] == '\0') {
    if (b->is_used_[4] == '\0') {
      memset(out->distance_,0,0xa0);
      goto LAB_00136d39;
    }
    puVar3 = b->distance_;
  }
  else {
    puVar3 = a->distance_;
    if (b->is_used_[4] != '\0') {
      (*VP8LAddVector)(puVar3,b->distance_,out->distance_,0x28);
      goto LAB_00136d39;
    }
  }
  memcpy(out->distance_,puVar3,0xa0);
LAB_00136d39:
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    out->is_used_[lVar2] = b->is_used_[lVar2] | a->is_used_[lVar2];
  }
  return;
}

Assistant:

void VP8LHistogramAdd(const VP8LHistogram* WEBP_RESTRICT const a,
                      const VP8LHistogram* WEBP_RESTRICT const b,
                      VP8LHistogram* WEBP_RESTRICT const out) {
  int i;
  const int literal_size = VP8LHistogramNumCodes(a->palette_code_bits_);
  assert(a->palette_code_bits_ == b->palette_code_bits_);

  if (b != out) {
    ADD(0, literal_, literal_size);
    ADD(1, red_, NUM_LITERAL_CODES);
    ADD(2, blue_, NUM_LITERAL_CODES);
    ADD(3, alpha_, NUM_LITERAL_CODES);
    ADD(4, distance_, NUM_DISTANCE_CODES);
    for (i = 0; i < 5; ++i) {
      out->is_used_[i] = (a->is_used_[i] | b->is_used_[i]);
    }
  } else {
    ADD_EQ(0, literal_, literal_size);
    ADD_EQ(1, red_, NUM_LITERAL_CODES);
    ADD_EQ(2, blue_, NUM_LITERAL_CODES);
    ADD_EQ(3, alpha_, NUM_LITERAL_CODES);
    ADD_EQ(4, distance_, NUM_DISTANCE_CODES);
    for (i = 0; i < 5; ++i) out->is_used_[i] |= a->is_used_[i];
  }
}